

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O2

void recff_ffi_fill(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  TRef *pTVar2;
  CTState *cts;
  TRef TVar3;
  TRef TVar4;
  TRef TVar5;
  ulong uVar6;
  CTSize step;
  TValue *sval;
  CTSize sz;
  
  pTVar2 = J->base;
  TVar3 = *pTVar2;
  TVar4 = pTVar2[1];
  if (TVar4 != 0 && TVar3 != 0) {
    cts = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
    TVar5 = pTVar2[2];
    sval = rd->argv;
    if ((sval->field_4).it >> 0xf == 0x1fff5) {
      uVar6 = (ulong)*(ushort *)(((ulong)sval->field_4 & 0x7fffffffffff) + 10);
      uVar1 = cts->tab[uVar6].info;
      if ((uVar1 & 0xf0000000) == 0x20000000) {
        uVar6 = (ulong)(uVar1 & 0xffff);
      }
      lj_ctype_info(cts,(CTypeID)((uVar6 * 0x18) / 0x18),&sz);
      sval = rd->argv;
    }
    TVar3 = crec_ct_tv(J,cts->tab + 0x11,0,TVar3,sval);
    step = (CTSize)sval;
    TVar4 = crec_toint(J,cts,TVar4,rd->argv + 1);
    if (TVar5 == 0) {
      TVar5 = lj_ir_kint(J,0);
    }
    else {
      TVar5 = crec_toint(J,cts,TVar5,rd->argv + 2);
    }
    rd->nres = 0;
    crec_fill(J,TVar3,TVar4,TVar5,step);
  }
  return;
}

Assistant:

void LJ_FASTCALL recff_ffi_fill(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  TRef trdst = J->base[0], trlen = J->base[1], trfill = J->base[2];
  if (trdst && trlen) {
    CTSize step = 1;
    if (tviscdata(&rd->argv[0])) {  /* Get alignment of original destination. */
      CTSize sz;
      CType *ct = ctype_raw(cts, cdataV(&rd->argv[0])->ctypeid);
      if (ctype_isptr(ct->info))
	ct = ctype_rawchild(cts, ct);
      step = (1u<<ctype_align(lj_ctype_info(cts, ctype_typeid(cts, ct), &sz)));
    }
    trdst = crec_ct_tv(J, ctype_get(cts, CTID_P_VOID), 0, trdst, &rd->argv[0]);
    trlen = crec_toint(J, cts, trlen, &rd->argv[1]);
    if (trfill)
      trfill = crec_toint(J, cts, trfill, &rd->argv[2]);
    else
      trfill = lj_ir_kint(J, 0);
    rd->nres = 0;
    crec_fill(J, trdst, trlen, trfill, step);
  }  /* else: interpreter will throw. */
}